

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirWatcherGeneric.cpp
# Opt level: O0

void __thiscall efsw::DirWatcherGeneric::~DirWatcherGeneric(DirWatcherGeneric *this)

{
  DirWatcherGeneric *this_00;
  bool bVar1;
  reference pFVar2;
  pointer ppVar3;
  _Self local_170;
  _Self local_168;
  iterator it;
  allocator<char> local_151;
  string local_150;
  _Self local_130;
  _List_node_base *local_128;
  _List_node_base *local_120;
  allocator<char> local_111;
  string local_110;
  _Self local_f0;
  _List_node_base *local_e8;
  _List_iterator<efsw::FileInfo> local_e0;
  iterator it_1;
  DirectorySnapshotDiff Diff;
  DirWatcherGeneric *this_local;
  
  Diff._192_8_ = this;
  if ((this->Deleted & 1U) != 0) {
    DirectorySnapshot::scan((DirectorySnapshotDiff *)&it_1,&this->DirSnap);
    bVar1 = DirectorySnapshot::exists(&this->DirSnap);
    if (!bVar1) {
      std::_List_iterator<efsw::FileInfo>::_List_iterator(&local_e0);
      local_e8 = (_List_node_base *)
                 std::__cxx11::list<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::begin
                           ((list<efsw::FileInfo,_std::allocator<efsw::FileInfo>_> *)&it_1);
      local_e0._M_node = local_e8;
      while( true ) {
        local_f0._M_node =
             (_List_node_base *)
             std::__cxx11::list<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::end
                       ((list<efsw::FileInfo,_std::allocator<efsw::FileInfo>_> *)&it_1);
        bVar1 = std::operator!=(&local_e0,&local_f0);
        if (!bVar1) break;
        pFVar2 = std::_List_iterator<efsw::FileInfo>::operator*(&local_e0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"",&local_111);
        handleAction(this,&pFVar2->Filepath,2,&local_110);
        std::__cxx11::string::~string((string *)&local_110);
        std::allocator<char>::~allocator(&local_111);
        local_120 = (_List_node_base *)std::_List_iterator<efsw::FileInfo>::operator++(&local_e0,0);
      }
      local_128 = (_List_node_base *)
                  std::__cxx11::list<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::begin
                            ((list<efsw::FileInfo,_std::allocator<efsw::FileInfo>_> *)
                             &Diff.FilesMoved.
                              super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                              ._M_impl._M_node._M_size);
      local_e0._M_node = local_128;
      while( true ) {
        local_130._M_node =
             (_List_node_base *)
             std::__cxx11::list<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::end
                       ((list<efsw::FileInfo,_std::allocator<efsw::FileInfo>_> *)
                        &Diff.FilesMoved.
                         super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                         ._M_impl._M_node._M_size);
        bVar1 = std::operator!=(&local_e0,&local_130);
        if (!bVar1) break;
        pFVar2 = std::_List_iterator<efsw::FileInfo>::operator*(&local_e0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"",&local_151);
        handleAction(this,&pFVar2->Filepath,2,&local_150);
        std::__cxx11::string::~string((string *)&local_150);
        std::allocator<char>::~allocator(&local_151);
        it._M_node = (_Base_ptr)std::_List_iterator<efsw::FileInfo>::operator++(&local_e0,0);
      }
    }
    DirectorySnapshotDiff::~DirectorySnapshotDiff((DirectorySnapshotDiff *)&it_1);
  }
  local_168._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>_>
       ::begin(&this->Directories);
  while( true ) {
    local_170._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>_>
         ::end(&this->Directories);
    bVar1 = std::operator!=(&local_168,&local_170);
    if (!bVar1) break;
    if ((this->Deleted & 1U) != 0) {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>
               ::operator->(&local_168);
      ppVar3->second->Deleted = true;
    }
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>
             ::operator->(&local_168);
    if (ppVar3->second != (DirWatcherGeneric *)0x0) {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>
               ::operator->(&local_168);
      this_00 = ppVar3->second;
      if (this_00 != (DirWatcherGeneric *)0x0) {
        ~DirWatcherGeneric(this_00);
        operator_delete(this_00,0xc0);
      }
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>
               ::operator->(&local_168);
      ppVar3->second = (DirWatcherGeneric *)0x0;
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>
    ::operator++(&local_168,0);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>_>
  ::~map(&this->Directories);
  DirectorySnapshot::~DirectorySnapshot(&this->DirSnap);
  return;
}

Assistant:

DirWatcherGeneric::~DirWatcherGeneric()
{
	/// If the directory was deleted mark the files as deleted
	if ( Deleted )
	{
		DirectorySnapshotDiff Diff = DirSnap.scan();

		if ( !DirSnap.exists() )
		{
			FileInfoList::iterator it;

			DiffIterator( FilesDeleted )
			{
				handleAction( (*it).Filepath, Actions::Delete );
			}

			DiffIterator( DirsDeleted )
			{
				handleAction( (*it).Filepath, Actions::Delete );
			}
		}
	}

	DirWatchMap::iterator it = Directories.begin();

	for ( ; it != Directories.end(); it++ )
	{
		if ( Deleted )
		{
			/// If the directory was deleted, mark the flag for file deletion
			it->second->Deleted = true;
		}

		efSAFE_DELETE( it->second );
	}
}